

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O3

bool cbtClampNormal(cbtVector3 *edge,cbtVector3 *tri_normal_org,cbtVector3 *localContactNormalOnB,
                   cbtScalar correctedEdgeAngle,cbtVector3 *clampedLocalNormal)

{
  float fVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  cbtQuaternion local_58;
  cbtMatrix3x3 local_48;
  
  fVar10 = tri_normal_org->m_floats[2];
  fVar1 = tri_normal_org->m_floats[1];
  fVar11 = tri_normal_org->m_floats[0];
  auVar7 = vfmsub231ss_fma(ZEXT416((uint)(fVar10 * edge->m_floats[0])),ZEXT416((uint)fVar11),
                           ZEXT416((uint)edge->m_floats[2]));
  auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * edge->m_floats[2])),
                           ZEXT416((uint)edge->m_floats[1]),ZEXT416((uint)fVar10));
  auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * edge->m_floats[1])),ZEXT416((uint)fVar1),
                           ZEXT416((uint)edge->m_floats[0]));
  fVar12 = auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(localContactNormalOnB->m_floats[1] * fVar1)),
                           ZEXT416((uint)localContactNormalOnB->m_floats[0]),ZEXT416((uint)fVar11));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar8,auVar8);
  auVar6 = vfmadd231ss_fma(auVar7,ZEXT416((uint)localContactNormalOnB->m_floats[2]),
                           ZEXT416((uint)fVar10));
  auVar7 = vfmadd231ss_fma(auVar5,auVar9,auVar9);
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  fVar10 = 1.0 / auVar7._0_4_;
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(localContactNormalOnB->m_floats[1] * fVar12 * fVar10)),
                           ZEXT416((uint)localContactNormalOnB->m_floats[0]),
                           ZEXT416((uint)(auVar8._0_4_ * fVar10)));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)localContactNormalOnB->m_floats[2]),
                           ZEXT416((uint)(auVar9._0_4_ * fVar10)));
  fVar10 = atan2f(auVar7._0_4_,auVar6._0_4_);
  if ((0.0 <= correctedEdgeAngle) || (correctedEdgeAngle <= fVar10)) {
    if (correctedEdgeAngle < 0.0) {
      return false;
    }
    if (fVar10 <= correctedEdgeAngle) {
      return false;
    }
  }
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(edge->m_floats[1] * edge->m_floats[1])),
                           ZEXT416((uint)edge->m_floats[0]),ZEXT416((uint)edge->m_floats[0]));
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)edge->m_floats[2]),ZEXT416((uint)edge->m_floats[2]),auVar7)
  ;
  auVar7 = vsqrtss_avx(auVar7,auVar7);
  fVar1 = (correctedEdgeAngle - fVar10) * 0.5;
  fVar11 = sinf(fVar1);
  fVar11 = fVar11 / auVar7._0_4_;
  uVar4 = *(undefined8 *)edge->m_floats;
  fVar10 = edge->m_floats[2];
  local_58.super_cbtQuadWord.m_floats[3] = cosf(fVar1);
  auVar7._4_4_ = (float)((ulong)uVar4 >> 0x20) * fVar11;
  auVar7._0_4_ = (float)uVar4 * fVar11;
  auVar7._8_4_ = fVar11 * 0.0;
  auVar7._12_4_ = fVar11 * 0.0;
  local_58.super_cbtQuadWord.m_floats._0_8_ = vmovlps_avx(auVar7);
  local_58.super_cbtQuadWord.m_floats[2] = fVar11 * fVar10;
  cbtMatrix3x3::setRotation(&local_48,&local_58);
  fVar10 = localContactNormalOnB->m_floats[1];
  cVar2 = localContactNormalOnB->m_floats[0];
  cVar3 = localContactNormalOnB->m_floats[2];
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_48.m_el[0].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[0].m_floats[0]));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_48.m_el[1].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[1].m_floats[0]));
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * local_48.m_el[2].m_floats[1])),
                           ZEXT416((uint)cVar2),ZEXT416((uint)local_48.m_el[2].m_floats[0]));
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[0].m_floats[2]));
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[1].m_floats[2]));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)cVar3),ZEXT416((uint)local_48.m_el[2].m_floats[2]));
  auVar7 = vinsertps_avx(auVar7,auVar5,0x10);
  auVar7 = vinsertps_avx(auVar7,auVar6,0x28);
  *(undefined1 (*) [16])clampedLocalNormal->m_floats = auVar7;
  return true;
}

Assistant:

bool cbtClampNormal(const cbtVector3& edge, const cbtVector3& tri_normal_org, const cbtVector3& localContactNormalOnB, cbtScalar correctedEdgeAngle, cbtVector3& clampedLocalNormal)
{
	cbtVector3 tri_normal = tri_normal_org;
	//we only have a local triangle normal, not a local contact normal -> only normal in world space...
	//either compute the current angle all in local space, or all in world space

	cbtVector3 edgeCross = edge.cross(tri_normal).normalize();
	cbtScalar curAngle = cbtGetAngle(edgeCross, tri_normal, localContactNormalOnB);

	if (correctedEdgeAngle < 0)
	{
		if (curAngle < correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}

	if (correctedEdgeAngle >= 0)
	{
		if (curAngle > correctedEdgeAngle)
		{
			cbtScalar diffAngle = correctedEdgeAngle - curAngle;
			cbtQuaternion rotation(edge, diffAngle);
			clampedLocalNormal = cbtMatrix3x3(rotation) * localContactNormalOnB;
			return true;
		}
	}
	return false;
}